

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::scalarConstructorTest<false>(ViewTest *this)

{
  size_t sVar1;
  bool local_79;
  bool local_65 [20];
  allocator<int> local_51;
  undefined1 local_50 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  ViewTest *this_local;
  
  v.geometry_._48_8_ = this;
  std::allocator<int>::allocator(&local_51);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50,&this->scalar_,&local_51);
  std::allocator<int>::~allocator(&local_51);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
  local_79 = false;
  if (sVar1 == 1) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
    local_79 = sVar1 == 0;
  }
  local_65[0] = local_79;
  test(local_65);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
  return;
}

Assistant:

void ViewTest::scalarConstructorTest() {
    andres::View<int, constTarget> v(&scalar_); 
    
    test(v.size() == 1 &&
           v.dimension() == 0);
}